

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

void __thiscall Pl_PNGFilter::decodeUp(Pl_PNGFilter *this)

{
  uchar *puVar1;
  uchar *puVar2;
  uint local_24;
  uchar up;
  uint i;
  uchar *above_buffer;
  uchar *buffer;
  Pl_PNGFilter *this_local;
  
  QTC::TC("libtests","Pl_PNGFilter decodeUp",0);
  puVar1 = this->cur_row;
  puVar2 = this->prev_row;
  for (local_24 = 0; local_24 < this->bytes_per_row; local_24 = local_24 + 1) {
    puVar1[(ulong)local_24 + 1] = puVar1[(ulong)local_24 + 1] + puVar2[(ulong)local_24 + 1];
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodeUp()
{
    QTC::TC("libtests", "Pl_PNGFilter decodeUp");
    unsigned char* buffer = this->cur_row + 1;
    unsigned char* above_buffer = this->prev_row + 1;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        unsigned char up = above_buffer[i];
        buffer[i] = static_cast<unsigned char>(buffer[i] + up);
    }
}